

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.h
# Opt level: O2

void __thiscall Controller::CallAction(Controller *this)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  Tools *pTVar5;
  NewChangeDot *this_00;
  NewChangeForFile *this_01;
  string *this_02;
  allocator<char> local_d9;
  Initialize init;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_38,(((this->
                        super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )._command)->_M_dataplus)._M_p,(allocator<char> *)&init);
  iVar3 = (**(this->
             super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._vptr_ControllerBase)(this);
  std::__cxx11::string::~string(local_38);
  if ((char)iVar3 == '\0') {
    return;
  }
  pcVar1 = (((this->
             super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._command)->_M_dataplus)._M_p;
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at((this->
                super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._operations,0);
  bVar2 = std::operator==(pcVar1,pvVar4);
  if (bVar2) {
    this_02 = &init.path;
    Initialize::Initialize((Initialize *)this_02);
  }
  else {
    pcVar1 = (((this->
               super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._command)->_M_dataplus)._M_p;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::at((this->
                  super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._operations,1);
    bVar2 = std::operator==(pcVar1,pvVar4);
    if (bVar2) {
      pTVar5 = Tools::getInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,".stn",(allocator<char> *)&init);
      bVar2 = Tools::SearchFileFromDir(pTVar5,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if (!bVar2) {
        return;
      }
      pTVar5 = Tools::getInstance();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,
                 (((this->
                   super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._arg)->_M_dataplus)._M_p,&local_d9);
      Tools::CheckLine(&init.path,pTVar5,&local_78);
      bVar2 = std::operator==(&init.path,"dot");
      std::__cxx11::string::~string((string *)&init.path);
      std::__cxx11::string::~string((string *)&local_78);
      if (bVar2) {
        this_00 = (NewChangeDot *)operator_new(0x58);
        NewChangeDot::NewChangeDot(this_00);
        (**(this_00->
           super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._vptr_NewChangeBase)(this_00);
        (*(this_00->
          super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )._vptr_NewChangeBase[1])(this_00);
        return;
      }
      this_01 = (NewChangeForFile *)operator_new(0x78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,
                 (((this->
                   super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._arg)->_M_dataplus)._M_p,(allocator<char> *)&init);
      NewChangeForFile::NewChangeForFile(this_01,&local_98);
      (**(this_01->
         super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         )._vptr_NewChangeBase)(this_01);
      (*(this_01->
        super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )._vptr_NewChangeBase[1])(this_01);
      this_02 = &local_98;
    }
    else {
      pcVar1 = (((this->
                 super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._command)->_M_dataplus)._M_p;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((this->
                    super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )._operations,2);
      bVar2 = std::operator==(pcVar1,pvVar4);
      if (!bVar2) {
        return;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,
                 (((this->
                   super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   )._arg)->_M_dataplus)._M_p,&local_d9);
      NewCommit::NewCommit((NewCommit *)&init,&local_b8);
      this_02 = &local_b8;
    }
  }
  std::__cxx11::string::~string((string *)this_02);
  return;
}

Assistant:

virtual void CallAction() override {
        if (this->FindOperation(this->_command->data())) {
            if (this->_command->data() == this->_operations->at(0)) {
                Initialize init;
            } else if (this->_command->data() == this->_operations->at(1)) {
                if (Tools::getInstance()->SearchFileFromDir(".stn")) {
                    NewChangeBuilder *newChange = new NewChangeBuilder();
                    if (Tools::getInstance()->CheckLine(this->_arg->data()) == "dot") {
                        newChange->Build(new NewChangeDot());
                    } else {
                        newChange->Build(new NewChangeForFile(this->_arg->data()));
                    }
                }
            } else if (this->_command->data() == this->_operations->at(2)) {
                NewCommit newCommit(this->_arg->data());
            }
        }
    }